

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_segment.cpp
# Opt level: O1

void duckdb::SwapTupleDataSegment(TupleDataSegment *a,TupleDataSegment *b)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  TupleDataLayout *pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  idx_t iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  pointer pTVar12;
  pointer pTVar13;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_68;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_48;
  
  uVar6 = *(undefined4 *)
           &(a->allocator).internal.
            super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar7 = *(undefined4 *)
           ((long)&(a->allocator).internal.
                   super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           + 4);
  uVar8 = *(undefined4 *)
           &(a->allocator).internal.
            super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  uVar9 = *(undefined4 *)
           ((long)&(a->allocator).internal.
                   super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 4);
  (a->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (a->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar10 = (b->allocator).internal.
            super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var11 = (b->allocator).internal.
            super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (b->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (b->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (a->allocator).internal.
           super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (a->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar10;
  (a->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var11;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (b->allocator).internal.
           super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  *(undefined4 *)
   &(b->allocator).internal.
    super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar6;
  *(undefined4 *)
   ((long)&(b->allocator).internal.
           super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       uVar7;
  *(undefined4 *)
   &(b->allocator).internal.
    super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       uVar8;
  *(undefined4 *)
   ((long)&(b->allocator).internal.
           super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 4) = uVar9;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pTVar2 = (a->layout)._M_data;
  (a->layout)._M_data = (b->layout)._M_data;
  (b->layout)._M_data = pTVar2;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(a->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(a->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(a->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>::_M_move_assign
            (&(a->chunks).
              super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>,
             &b->chunks);
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(b->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(b->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(b->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_68.
                super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_68.
                super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_68.
                super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>::~vector
            ((vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_> *)&local_48);
  ::std::vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>::~vector
            ((vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_> *)&local_68);
  pTVar3 = (a->chunk_parts).
           super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
           super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar12 = (a->chunk_parts).
            super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
            super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar13 = (a->chunk_parts).
            super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
            super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (a->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>::
  _M_move_assign(&(a->chunk_parts).
                  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
                 ,&b->chunk_parts);
  pTVar4 = (b->chunk_parts).
           super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
           super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (b->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_start = pTVar12;
  (b->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_finish = pTVar13;
  (b->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar3;
  if (pTVar4 != (pointer)0x0) {
    operator_delete(pTVar4);
  }
  iVar5 = a->count;
  a->count = b->count;
  b->count = iVar5;
  iVar5 = a->data_size;
  a->data_size = b->data_size;
  b->data_size = iVar5;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (a->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (a->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (a->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (a->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::_M_move_assign
            (&(a->pinned_row_handles).
              super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
             &b->pinned_row_handles);
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (b->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (b->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (b->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (b->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_48);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_68);
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (a->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (a->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (a->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (a->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::_M_move_assign
            (&(a->pinned_heap_handles).
              super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
             &b->pinned_heap_handles);
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (b->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (b->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (b->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (b->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_48);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_68);
  return;
}

Assistant:

void SwapTupleDataSegment(TupleDataSegment &a, TupleDataSegment &b) {
	std::swap(a.allocator, b.allocator);
	std::swap(a.layout, b.layout);
	std::swap(a.chunks, b.chunks);
	std::swap(a.chunk_parts, b.chunk_parts);
	std::swap(a.count, b.count);
	std::swap(a.data_size, b.data_size);
	std::swap(a.pinned_row_handles, b.pinned_row_handles);
	std::swap(a.pinned_heap_handles, b.pinned_heap_handles);
}